

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O3

void anon_unknown.dwarf_2f4795::check<half>(istream *is,half c)

{
  ostream *poVar1;
  uchar b [2];
  half local_1a;
  
  std::istream::read((char *)is,(long)&local_1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"4half",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": expected ",0xb);
  poVar1 = operator<<((ostream *)&std::cout,c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
  poVar1 = operator<<(poVar1,local_1a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((half::_toFloat[c._h].f == half::_toFloat[local_1a._h].f) &&
     (!NAN(half::_toFloat[c._h].f) && !NAN(half::_toFloat[local_1a._h].f))) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testXdr.cpp"
                ,0x85,"void (anonymous namespace)::check(istream &, T) [T = half]");
}

Assistant:

void
check (istream &is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid(v).name() << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}